

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O2

Abc_Ntk_t * Io_ReadBlifNetworkOne(Io_ReadBlif_t *p)

{
  char cVar1;
  byte Entry;
  void **ppvVar2;
  Abc_Ntk_t *pAVar3;
  double dVar4;
  bool bVar5;
  bool bVar6;
  FILE *pFile;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  Abc_Ntk_t *pAVar12;
  char *pcVar13;
  char *pcVar14;
  Vec_Ptr_t *pVVar15;
  Mio_Library_t *pLib;
  size_t sVar16;
  Mio_Gate_t *pMVar17;
  Mio_Gate_t *pMVar18;
  Abc_Obj_t *pAVar19;
  void *pvVar20;
  undefined8 uVar21;
  void *pvVar22;
  int i;
  ulong uVar23;
  long lVar24;
  char *pcVar25;
  Vec_Str_t *pVVar26;
  Vec_Int_t *pVVar27;
  ulong uVar28;
  char **pNamesIn;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 uVar31;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  char *pFoo1;
  char *local_68;
  Abc_Ntk_t *local_60;
  undefined1 local_58 [16];
  ProgressBar *local_40;
  Abc_Ntk_t *local_38;
  
  if (p->vTokens == (Vec_Ptr_t *)0x0) {
    __assert_fail("p->vTokens != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                  ,0xf2,"Abc_Ntk_t *Io_ReadBlifNetworkOne(Io_ReadBlif_t *)");
  }
  pAVar12 = Abc_NtkAlloc(ABC_NTK_NETLIST,ABC_FUNC_SOP,1);
  p->pNtkCur = pAVar12;
  pVVar15 = p->vTokens;
  pcVar13 = (char *)*pVVar15->pArray;
  iVar7 = strcmp(pcVar13,".model");
  if (iVar7 == 0) {
    if (pVVar15->nSize != 2) {
      iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
      p->LineCur = iVar7;
      builtin_strncpy(p->sError,"The .model line does not have exactly two entries.",0x33);
      Io_ReadBlifPrintErrorMessage(p);
      return (Abc_Ntk_t *)0x0;
    }
    pcVar13 = (char *)Vec_PtrEntry(pVVar15,1);
    pcVar25 = pcVar13;
    do {
      do {
        pcVar14 = pcVar13;
        pcVar13 = pcVar25 + 1;
        cVar1 = *pcVar25;
        pcVar25 = pcVar13;
      } while (cVar1 == '/');
    } while ((cVar1 == '\\') || (pcVar13 = pcVar14, cVar1 != '\0'));
    pcVar13 = Extra_UtilStrsav(pcVar14);
    pAVar12->pName = pcVar13;
  }
  else {
    iVar7 = strcmp(pcVar13,".exdc");
    if (iVar7 != 0) {
      pcVar13 = p->pFileName;
      uVar8 = Extra_FileReaderGetLineNumber(p->pReader,0);
      printf("%s: File parsing skipped after line %d (\"%s\").\n",pcVar13,(ulong)uVar8,
             *p->vTokens->pArray);
      Abc_NtkDelete(pAVar12);
      p->pNtkCur = (Abc_Ntk_t *)0x0;
      return (Abc_Ntk_t *)0x0;
    }
  }
  pFile = _stdout;
  local_38 = pAVar12;
  if (p->pNtkMaster == (Abc_Ntk_t *)0x0) {
    iVar7 = Extra_FileReaderGetFileSize(p->pReader);
    local_40 = Extra_ProgressBarStart(pFile,iVar7);
  }
  else {
    local_40 = (ProgressBar *)0x0;
  }
  pcVar13 = p->sError;
  uVar8 = 0;
  bVar5 = false;
  bVar6 = false;
  do {
    if (!bVar5) {
      pVVar15 = Io_ReadBlifGetTokens(p);
      p->vTokens = pVVar15;
      if (pVVar15 == (Vec_Ptr_t *)0x0) goto LAB_002da2e7;
    }
    if (((p->pNtkMaster == (Abc_Ntk_t *)0x0) && (uVar8 % 1000 == 0)) &&
       ((iVar7 = Extra_FileReaderGetCurPosition(p->pReader), local_40 == (ProgressBar *)0x0 ||
        (local_40->nItemsNext <= iVar7)))) {
      Extra_ProgressBarUpdate_int(local_40,iVar7,(char *)0x0);
    }
    pVVar15 = p->vTokens;
    ppvVar2 = pVVar15->pArray;
    pcVar25 = (char *)*ppvVar2;
    iVar7 = strcmp(pcVar25,".names");
    if (iVar7 == 0) {
      if (pVVar15->nSize < 2) {
        iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
        p->LineCur = iVar7;
        builtin_strncpy(pcVar13,"The .names line has less than two tokens.",0x2a);
LAB_002d9730:
        Io_ReadBlifPrintErrorMessage(p);
        bVar6 = true;
        bVar5 = true;
        goto LAB_002d9f31;
      }
      local_60 = p->pNtkCur;
      uVar9 = pVVar15->nSize - 2;
      pAVar19 = Io_ReadCreateNode(local_60,(char *)ppvVar2[(ulong)uVar9 + 1],(char **)(ppvVar2 + 1),
                                  uVar9);
      p->vCubes->nSize = 0;
      local_58._0_8_ = pAVar19;
      if (pVVar15->nSize == 2) {
LAB_002d91fe:
        pVVar15 = Io_ReadBlifGetTokens(p);
        if (pVVar15 != (Vec_Ptr_t *)0x0) {
          cVar1 = **pVVar15->pArray;
          if (cVar1 != '.') {
            if (pVVar15->nSize == 1) break;
            iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
            p->LineCur = iVar7;
            builtin_strncpy(pcVar13,"The number of tokens in the cons",0x20);
LAB_002d96ec:
            builtin_strncpy(p->sError + 0x20,"tant cube is wrong.",0x14);
            goto LAB_002d9730;
          }
          goto LAB_002d94cf;
        }
        goto LAB_002d94cc;
      }
      while (pVVar15 = Io_ReadBlifGetTokens(p), pVVar15 != (Vec_Ptr_t *)0x0) {
        pcVar25 = (char *)*pVVar15->pArray;
        if (*pcVar25 == '.') goto LAB_002d94cf;
        if (pVVar15->nSize != 2) {
          iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
          p->LineCur = iVar7;
          builtin_strncpy(pcVar13,"The number of tokens in the cube is wrong.",0x2b);
          goto LAB_002d9730;
        }
        pVVar26 = p->vCubes;
        sVar16 = strlen(pcVar25);
        uVar28 = sVar16 & 0xffffffff;
        if ((int)sVar16 < 1) {
          uVar28 = 0;
        }
        for (uVar23 = 0; uVar28 != uVar23; uVar23 = uVar23 + 1) {
          Vec_StrPush(pVVar26,pcVar25[uVar23]);
        }
        Entry = *pVVar15->pArray[1];
        uVar9 = (uint)Entry;
        if (((1 < uVar9 - 0x30) && (uVar9 != 0x6e)) && (uVar9 != 0x78)) {
          iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
          p->LineCur = iVar7;
          builtin_strncpy(pcVar13,"The output character in the cons",0x20);
          goto LAB_002d96ec;
        }
        Vec_StrPush(p->vCubes,' ');
        Vec_StrPush(p->vCubes,Entry);
        Vec_StrPush(p->vCubes,'\n');
        pAVar19 = (Abc_Obj_t *)local_58._0_8_;
      }
LAB_002d94cc:
      pVVar15 = (Vec_Ptr_t *)0x0;
LAB_002d94cf:
      pVVar26 = p->vCubes;
      if (pVVar26->nSize == 0) {
        Vec_StrPush(pVVar26,' ');
        Vec_StrPush(p->vCubes,'0');
        Vec_StrPush(p->vCubes,'\n');
        pVVar26 = p->vCubes;
      }
      Vec_StrPush(pVVar26,'\0');
      pcVar25 = Abc_SopRegister((Mem_Flex_t *)local_60->pManFunc,p->vCubes->pArray);
      (pAVar19->field_5).pData = pcVar25;
      iVar7 = (pAVar19->vFanins).nSize;
      iVar10 = Abc_SopGetVarNum(pcVar25);
      if (iVar7 != iVar10) {
        iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
        p->LineCur = iVar7;
        uVar9 = (pAVar19->vFanins).nSize;
        pcVar25 = Abc_ObjName((Abc_Obj_t *)pAVar19->pNtk->vObjs->pArray[*(pAVar19->vFanouts).pArray]
                             );
        uVar11 = Abc_SopGetVarNum((char *)(pAVar19->field_5).pData);
        sprintf(pcVar13,"The number of fanins (%d) of node %s is different from SOP size (%d).",
                (ulong)uVar9,pcVar25,(ulong)uVar11);
        goto LAB_002d9730;
      }
      p->vTokens = pVVar15;
      bVar6 = false;
      bVar5 = true;
      if (pVVar15 == (Vec_Ptr_t *)0x0) goto LAB_002da2e7;
    }
    else {
      iVar7 = strcmp(pcVar25,".gate");
      if (iVar7 == 0) {
        pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
        if (pLib == (Mio_Library_t *)0x0) {
          iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
          p->LineCur = iVar7;
          builtin_strncpy(pcVar13,"The current library is not available.",0x26);
        }
        else if (pVVar15->nSize < 2) {
          iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
          p->LineCur = iVar7;
          builtin_strncpy(pcVar13,"The .gate line has less than two tokens.",0x29);
        }
        else {
          pMVar17 = Mio_LibraryReadGateByName(pLib,(char *)pVVar15->pArray[1],(char *)0x0);
          if (pMVar17 == (Mio_Gate_t *)0x0) {
            iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
            p->LineCur = iVar7;
            pvVar22 = pVVar15->pArray[1];
            pcVar25 = "Cannot find gate \"%s\" in the library.";
          }
          else {
            pAVar12 = p->pNtkCur;
            if (pAVar12->nObjCounts[7] == 0) {
              if (pAVar12->ntkFunc != ABC_FUNC_SOP) {
                __assert_fail("p->pNtkCur->ntkFunc == ABC_FUNC_SOP",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                              ,0x2cd,"int Io_ReadBlifNetworkGate(Io_ReadBlif_t *, Vec_Ptr_t *)");
              }
              pAVar12->ntkFunc = ABC_FUNC_MAP;
              Mem_FlexStop((Mem_Flex_t *)pAVar12->pManFunc,0);
              p->pNtkCur->pManFunc = pLib;
            }
            pMVar18 = Mio_GateReadTwin(pMVar17);
            iVar7 = Io_ReadBlifReorderFormalNames(pVVar15,pMVar17,pMVar18);
            if (iVar7 != 0) {
              iVar7 = pVVar15->nSize;
              lVar24 = 2;
              do {
                if (iVar7 <= lVar24) {
                  pMVar18 = Mio_GateReadTwin(pMVar17);
                  ppvVar2 = pVVar15->pArray;
                  pNamesIn = (char **)(ppvVar2 + 2);
                  iVar7 = pVVar15->nSize;
                  if (pMVar18 == (Mio_Gate_t *)0x0) {
                    pAVar19 = Io_ReadCreateNode(p->pNtkCur,(char *)ppvVar2[(long)iVar7 + -1],
                                                pNamesIn,iVar7 + -3);
                    (pAVar19->field_5).pData = pMVar17;
                    goto LAB_002d94c2;
                  }
                  if ((char *)ppvVar2[(long)iVar7 + -2] == (char *)0x0) {
                    pcVar25 = (char *)ppvVar2[(long)iVar7 + -1];
                    if (pcVar25 == (char *)0x0) {
                      __assert_fail("ppNames[nNames] != NULL || ppNames[nNames+1] != NULL",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                                    ,0x2f6,
                                    "int Io_ReadBlifNetworkGate(Io_ReadBlif_t *, Vec_Ptr_t *)");
                    }
                  }
                  else {
                    pAVar19 = Io_ReadCreateNode(p->pNtkCur,(char *)ppvVar2[(long)iVar7 + -2],
                                                pNamesIn,iVar7 + -4);
                    (pAVar19->field_5).pData = pMVar17;
                    pcVar25 = (char *)ppvVar2[(long)iVar7 + -1];
                    if (pcVar25 == (char *)0x0) goto LAB_002d94c2;
                  }
                  pAVar19 = Io_ReadCreateNode(p->pNtkCur,pcVar25,pNamesIn,iVar7 + -4);
                  pMVar17 = Mio_GateReadTwin(pMVar17);
                  (pAVar19->field_5).pData = pMVar17;
                  goto LAB_002d94c2;
                }
                ppvVar2 = pVVar15->pArray;
                pcVar25 = Io_ReadBlifCleanName((char *)ppvVar2[lVar24]);
                ppvVar2[lVar24] = pcVar25;
                ppvVar2 = pVVar15->pArray + lVar24;
                lVar24 = lVar24 + 1;
              } while (*ppvVar2 != (void *)0x0);
              iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
              p->LineCur = iVar7;
              builtin_strncpy(pcVar13,"Invalid gate input assignment.",0x1f);
              goto LAB_002d98b7;
            }
            iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
            p->LineCur = iVar7;
            pvVar22 = pVVar15->pArray[1];
            pcVar25 = "Mismatch in the fanins of gate \"%s\".";
          }
LAB_002d98b0:
          sprintf(pcVar13,pcVar25,pvVar22);
        }
LAB_002d98b7:
        bVar5 = false;
        Io_ReadBlifPrintErrorMessage(p);
        bVar6 = true;
      }
      else {
        iVar7 = strcmp(pcVar25,".latch");
        if (iVar7 == 0) {
          if (pVVar15->nSize < 3) {
            iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
            p->LineCur = iVar7;
            builtin_strncpy(pcVar13,"The .latch line does not have enough tokens.",0x2d);
            goto LAB_002d98b7;
          }
          pAVar19 = Io_ReadCreateLatch(p->pNtkCur,(char *)ppvVar2[1],(char *)ppvVar2[2]);
          if ((long)pVVar15->nSize == 3) {
LAB_002d94ba:
            Abc_LatchSetInitDc(pAVar19);
            goto LAB_002d94c2;
          }
          uVar9 = atoi((char *)pVVar15->pArray[(long)pVVar15->nSize + -1]);
          if (2 < uVar9) {
            iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
            p->LineCur = iVar7;
            pvVar22 = pVVar15->pArray[3];
            pcVar25 = "The .latch line has an unknown reset value (%s).";
            goto LAB_002d98b0;
          }
          if (uVar9 == 2) goto LAB_002d94ba;
          if (uVar9 == 1) {
            if ((*(uint *)&pAVar19->field_0x14 & 0xf) != 8) {
              __assert_fail("Abc_ObjIsLatch(pLatch)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                            ,0x1a5,"void Abc_LatchSetInit1(Abc_Obj_t *)");
            }
            pAVar19->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x2;
          }
          else {
            if ((*(uint *)&pAVar19->field_0x14 & 0xf) != 8) {
              __assert_fail("Abc_ObjIsLatch(pLatch)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                            ,0x1a4,"void Abc_LatchSetInit0(Abc_Obj_t *)");
            }
            pAVar19->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
          }
          bVar5 = false;
          bVar6 = false;
        }
        else {
          iVar7 = strcmp(pcVar25,".inputs");
          if (iVar7 == 0) {
            for (lVar24 = 1; lVar24 < pVVar15->nSize; lVar24 = lVar24 + 1) {
              Io_ReadCreatePi(p->pNtkCur,(char *)pVVar15->pArray[lVar24]);
            }
          }
          else {
            iVar7 = strcmp(pcVar25,".outputs");
            if (iVar7 != 0) {
              iVar7 = strcmp(pcVar25,".input_arrival");
              if (iVar7 == 0) {
                iVar7 = strncmp(pcVar25,".input_arrival",0xe);
                if (iVar7 != 0) {
                  __assert_fail("strncmp( (char *)vTokens->pArray[0], \".input_arrival\", 14 ) == 0"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                                ,0x356,
                                "int Io_ReadBlifNetworkInputArrival(Io_ReadBlif_t *, Vec_Ptr_t *)");
                }
                if (pVVar15->nSize == 4) {
                  pAVar19 = Abc_NtkFindNet(p->pNtkCur,(char *)ppvVar2[1]);
                  if (pAVar19 != (Abc_Obj_t *)0x0) {
                    dVar4 = strtod((char *)pVVar15->pArray[2],&pFoo1);
                    local_58._0_8_ = dVar4;
                    pAVar12 = (Abc_Ntk_t *)strtod((char *)pVVar15->pArray[3],&local_68);
                    if ((*pFoo1 == '\0') && (*local_68 == '\0')) {
                      local_60 = pAVar12;
                      Vec_IntPush(p->vInArrs,
                                  *(int *)((long)pAVar19->pNtk->vObjs->pArray
                                                 [*(pAVar19->vFanins).pArray] + 0x10));
                      Vec_IntPush(p->vInArrs,(int)(float)(double)local_58._0_8_);
                      pVVar27 = p->vInArrs;
LAB_002d9ff9:
                      Vec_IntPush(pVVar27,(int)(float)(double)local_60);
                      goto LAB_002da12d;
                    }
                    iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                    p->LineCur = iVar7;
                    pvVar22 = pVVar15->pArray[2];
                    pvVar20 = pVVar15->pArray[3];
                    pcVar25 = "Bad value (%s %s) for rise or fall time on .input_arrival line.";
                    goto LAB_002d9f17;
                  }
                  iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                  p->LineCur = iVar7;
                  pvVar22 = pVVar15->pArray[1];
                  pcVar25 = "Cannot find object corresponding to %s on .input_arrival line.";
LAB_002d9c6c:
                  sprintf(pcVar13,pcVar25,pvVar22);
                }
                else {
                  iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                  p->LineCur = iVar7;
                  builtin_strncpy(pcVar13,"Wrong number of arguments on .input_arrival line.",0x32);
                }
LAB_002d9f1e:
                Io_ReadBlifPrintErrorMessage(p);
                bVar6 = true;
              }
              else {
                iVar7 = strcmp(pcVar25,".output_required");
                if (iVar7 == 0) {
                  iVar7 = strncmp(pcVar25,".output_required",0x10);
                  if (iVar7 != 0) {
                    __assert_fail("strncmp( (char *)vTokens->pArray[0], \".output_required\", 16 ) == 0"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                                  ,0x389,
                                  "int Io_ReadBlifNetworkOutputRequired(Io_ReadBlif_t *, Vec_Ptr_t *)"
                                 );
                  }
                  if (pVVar15->nSize == 4) {
                    pAVar19 = Abc_NtkFindNet(p->pNtkCur,(char *)ppvVar2[1]);
                    if (pAVar19 == (Abc_Obj_t *)0x0) {
                      iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                      p->LineCur = iVar7;
                      pvVar22 = pVVar15->pArray[1];
                      pcVar25 = "Cannot find object corresponding to %s on .output_required line.";
                      goto LAB_002d9c6c;
                    }
                    dVar4 = strtod((char *)pVVar15->pArray[2],&pFoo1);
                    local_58._0_8_ = dVar4;
                    pAVar12 = (Abc_Ntk_t *)strtod((char *)pVVar15->pArray[3],&local_68);
                    if ((*pFoo1 == '\0') && (*local_68 == '\0')) {
                      local_60 = pAVar12;
                      Vec_IntPush(p->vOutReqs,
                                  *(int *)((long)pAVar19->pNtk->vObjs->pArray
                                                 [*(pAVar19->vFanouts).pArray] + 0x10));
                      Vec_IntPush(p->vOutReqs,(int)(float)(double)local_58._0_8_);
                      pVVar27 = p->vOutReqs;
                      goto LAB_002d9ff9;
                    }
                    iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                    p->LineCur = iVar7;
                    pvVar22 = pVVar15->pArray[2];
                    pvVar20 = pVVar15->pArray[3];
                    pcVar25 = "Bad value (%s %s) for rise or fall time on .output_required line.";
                    goto LAB_002d9f17;
                  }
                  iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                  p->LineCur = iVar7;
                  builtin_strncpy(pcVar13,"Wrong number of arguments on .output_required line.",0x34
                                 );
                  goto LAB_002d9f1e;
                }
                iVar7 = strcmp(pcVar25,".default_input_arrival");
                if (iVar7 == 0) {
                  iVar7 = strncmp(pcVar25,".default_input_arrival",0x17);
                  if (iVar7 != 0) {
                    __assert_fail("strncmp( (char *)vTokens->pArray[0], \".default_input_arrival\", 23 ) == 0"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                                  ,0x3bb,
                                  "int Io_ReadBlifNetworkDefaultInputArrival(Io_ReadBlif_t *, Vec_Ptr_t *)"
                                 );
                  }
                  if (pVVar15->nSize != 3) {
                    iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                    p->LineCur = iVar7;
                    builtin_strncpy(pcVar13,
                                    "Wrong number of arguments on .default_input_arrival line.",0x3a
                                   );
                    goto LAB_002d9f1e;
                  }
                  dVar4 = strtod((char *)ppvVar2[1],&pFoo1);
                  local_58._8_4_ = extraout_XMM0_Dc;
                  local_58._0_8_ = dVar4;
                  local_58._12_4_ = extraout_XMM0_Dd;
                  dVar4 = strtod((char *)pVVar15->pArray[2],&local_68);
                  if ((*pFoo1 == '\0') && (*local_68 == '\0')) {
                    p->DefInArrRise = (float)(double)local_58._0_8_;
                    p->DefInArrFall = (float)dVar4;
                    p->fHaveDefInArr = 1;
                    goto LAB_002da12d;
                  }
                  iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                  p->LineCur = iVar7;
                  pvVar22 = pVVar15->pArray[1];
                  pvVar20 = pVVar15->pArray[2];
                  pcVar25 = 
                  "Bad value (%s %s) for rise or fall time on .default_input_arrival line.";
LAB_002d9f17:
                  sprintf(pcVar13,pcVar25,pvVar22,pvVar20);
                  goto LAB_002d9f1e;
                }
                iVar7 = strcmp(pcVar25,".default_output_required");
                if (iVar7 == 0) {
                  iVar7 = strncmp(pcVar25,".default_output_required",0x19);
                  if (iVar7 != 0) {
                    __assert_fail("strncmp( (char *)vTokens->pArray[0], \".default_output_required\", 25 ) == 0"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                                  ,0x3e5,
                                  "int Io_ReadBlifNetworkDefaultOutputRequired(Io_ReadBlif_t *, Vec_Ptr_t *)"
                                 );
                  }
                  if (pVVar15->nSize != 3) {
                    iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                    p->LineCur = iVar7;
                    builtin_strncpy(pcVar13,
                                    "Wrong number of arguments on .default_output_required line.",
                                    0x3c);
                    goto LAB_002d9f1e;
                  }
                  dVar4 = strtod((char *)ppvVar2[1],&pFoo1);
                  local_58._8_4_ = extraout_XMM0_Dc_00;
                  local_58._0_8_ = dVar4;
                  local_58._12_4_ = extraout_XMM0_Dd_00;
                  dVar4 = strtod((char *)pVVar15->pArray[2],&local_68);
                  if ((*pFoo1 == '\0') && (*local_68 == '\0')) {
                    p->DefOutReqRise = (float)(double)local_58._0_8_;
                    p->DefOutReqFall = (float)dVar4;
                    p->fHaveDefOutReq = 1;
                    goto LAB_002da12d;
                  }
                  iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                  p->LineCur = iVar7;
                  pvVar22 = pVVar15->pArray[1];
                  pvVar20 = pVVar15->pArray[2];
                  pcVar25 = 
                  "Bad value (%s %s) for rise or fall time on .default_output_required line.";
                  goto LAB_002d9f17;
                }
                iVar7 = strcmp(pcVar25,".input_drive");
                if (iVar7 == 0) {
                  iVar7 = strncmp(pcVar25,".input_drive",0xc);
                  if (iVar7 != 0) {
                    __assert_fail("strncmp( (char *)vTokens->pArray[0], \".input_drive\", 12 ) == 0"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                                  ,0x41a,
                                  "int Io_ReadBlifNetworkInputDrive(Io_ReadBlif_t *, Vec_Ptr_t *)");
                  }
                  if (pVVar15->nSize != 4) {
                    iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                    p->LineCur = iVar7;
                    builtin_strncpy(pcVar13,"Wrong number of arguments on .in",0x20);
                    uVar29._0_1_ = 'p';
                    uVar29._1_1_ = 'u';
                    uVar29._2_1_ = 't';
                    uVar29._3_1_ = '_';
                    uVar30._0_1_ = 'd';
                    uVar30._1_1_ = 'r';
                    uVar30._2_1_ = 'i';
                    uVar30._3_1_ = 'v';
                    uVar31._0_1_ = 'e';
                    uVar31._1_1_ = ' ';
                    uVar31._2_1_ = 'l';
                    uVar31._3_1_ = 'i';
LAB_002d9e43:
                    *(undefined4 *)(p->sError + 0x20) = uVar29;
                    *(undefined4 *)(p->sError + 0x24) = uVar30;
                    *(undefined4 *)(p->sError + 0x28) = uVar31;
                    p->sError[0x2c] = 'n';
                    p->sError[0x2d] = 'e';
                    p->sError[0x2e] = '.';
                    p->sError[0x2f] = '\0';
                    goto LAB_002d9f1e;
                  }
                  pAVar19 = Abc_NtkFindNet(p->pNtkCur,(char *)ppvVar2[1]);
                  if (pAVar19 == (Abc_Obj_t *)0x0) {
                    iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                    p->LineCur = iVar7;
                    pvVar22 = pVVar15->pArray[1];
                    pcVar25 = "Cannot find object corresponding to %s on .input_drive line.";
                    goto LAB_002d9c6c;
                  }
                  dVar4 = strtod((char *)pVVar15->pArray[2],&pFoo1);
                  local_58._0_8_ = dVar4;
                  pAVar12 = (Abc_Ntk_t *)strtod((char *)pVVar15->pArray[3],&local_68);
                  if ((*pFoo1 == '\0') && (*local_68 == '\0')) {
                    pAVar3 = p->pNtkCur;
                    pVVar27 = p->vInDrives;
                    local_60 = pAVar12;
                    pAVar19 = Abc_NtkObj(pAVar3,*(int *)((long)pAVar19->pNtk->vObjs->pArray
                                                               [*(pAVar19->vFanins).pArray] + 0x10))
                    ;
                    iVar7 = Io_ReadFindCiId(pAVar3,pAVar19);
                    Vec_IntPush(pVVar27,iVar7);
                    Vec_IntPush(p->vInDrives,(int)(float)(double)local_58._0_8_);
                    pVVar27 = p->vInDrives;
                    goto LAB_002d9ff9;
                  }
                  iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                  p->LineCur = iVar7;
                  pvVar22 = pVVar15->pArray[2];
                  pvVar20 = pVVar15->pArray[3];
                  pcVar25 = "Bad value (%s %s) for rise or fall time on .input_drive line.";
                  goto LAB_002d9f17;
                }
                iVar7 = strcmp(pcVar25,".output_load");
                if (iVar7 == 0) {
                  iVar7 = strncmp(pcVar25,".output_load",0xc);
                  if (iVar7 != 0) {
                    __assert_fail("strncmp( (char *)vTokens->pArray[0], \".output_load\", 12 ) == 0"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                                  ,0x456,
                                  "int Io_ReadBlifNetworkOutputLoad(Io_ReadBlif_t *, Vec_Ptr_t *)");
                  }
                  if (pVVar15->nSize != 4) {
                    iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                    p->LineCur = iVar7;
                    builtin_strncpy(pcVar13,"Wrong number of arguments on .ou",0x20);
                    uVar29._0_1_ = 't';
                    uVar29._1_1_ = 'p';
                    uVar29._2_1_ = 'u';
                    uVar29._3_1_ = 't';
                    uVar30._0_1_ = '_';
                    uVar30._1_1_ = 'l';
                    uVar30._2_1_ = 'o';
                    uVar30._3_1_ = 'a';
                    uVar31._0_1_ = 'd';
                    uVar31._1_1_ = ' ';
                    uVar31._2_1_ = 'l';
                    uVar31._3_1_ = 'i';
                    goto LAB_002d9e43;
                  }
                  pAVar19 = Abc_NtkFindNet(p->pNtkCur,(char *)ppvVar2[1]);
                  if (pAVar19 == (Abc_Obj_t *)0x0) {
                    iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                    p->LineCur = iVar7;
                    pvVar22 = pVVar15->pArray[1];
                    pcVar25 = "Cannot find object corresponding to %s on .output_load line.";
                    goto LAB_002d9c6c;
                  }
                  dVar4 = strtod((char *)pVVar15->pArray[2],&pFoo1);
                  local_58._0_8_ = dVar4;
                  pAVar12 = (Abc_Ntk_t *)strtod((char *)pVVar15->pArray[3],&local_68);
                  if ((*pFoo1 == '\0') && (*local_68 == '\0')) {
                    pAVar3 = p->pNtkCur;
                    pVVar27 = p->vOutLoads;
                    local_60 = pAVar12;
                    pAVar19 = Abc_NtkObj(pAVar3,*(int *)((long)pAVar19->pNtk->vObjs->pArray
                                                               [*(pAVar19->vFanouts).pArray] + 0x10)
                                        );
                    iVar7 = Io_ReadFindCoId(pAVar3,pAVar19);
                    Vec_IntPush(pVVar27,iVar7);
                    Vec_IntPush(p->vOutLoads,(int)(float)(double)local_58._0_8_);
                    pVVar27 = p->vOutLoads;
                    goto LAB_002d9ff9;
                  }
                  iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                  p->LineCur = iVar7;
                  pvVar22 = pVVar15->pArray[2];
                  pvVar20 = pVVar15->pArray[3];
                  pcVar25 = "Bad value (%s %s) for rise or fall time on .output_load line.";
                  goto LAB_002d9f17;
                }
                iVar7 = strcmp(pcVar25,".default_input_drive");
                if (iVar7 == 0) {
                  iVar7 = strncmp(pcVar25,".default_input_drive",0x15);
                  if (iVar7 != 0) {
                    __assert_fail("strncmp( (char *)vTokens->pArray[0], \".default_input_drive\", 21 ) == 0"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                                  ,0x488,
                                  "int Io_ReadBlifNetworkDefaultInputDrive(Io_ReadBlif_t *, Vec_Ptr_t *)"
                                 );
                  }
                  if (pVVar15->nSize != 3) {
                    iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                    p->LineCur = iVar7;
                    builtin_strncpy(pcVar13,"Wrong number of arguments on .default_input_driv",0x30)
                    ;
                    uVar21 = 0x2e656e696c2065;
LAB_002da0dd:
                    *(undefined8 *)(p->sError + 0x30) = uVar21;
                    goto LAB_002d9f1e;
                  }
                  dVar4 = strtod((char *)ppvVar2[1],&pFoo1);
                  local_58._8_4_ = extraout_XMM0_Dc_01;
                  local_58._0_8_ = dVar4;
                  local_58._12_4_ = extraout_XMM0_Dd_01;
                  dVar4 = strtod((char *)pVVar15->pArray[2],&local_68);
                  if ((*pFoo1 != '\0') || (*local_68 != '\0')) {
                    iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                    p->LineCur = iVar7;
                    pvVar22 = pVVar15->pArray[1];
                    pvVar20 = pVVar15->pArray[2];
                    pcVar25 = 
                    "Bad value (%s %s) for rise or fall time on .default_input_drive line.";
                    goto LAB_002d9f17;
                  }
                  p->DefInDriRise = (float)(double)local_58._0_8_;
                  p->DefInDriFall = (float)dVar4;
                  p->fHaveDefInDri = 1;
                }
                else {
                  iVar7 = strcmp(pcVar25,".default_output_load");
                  if (iVar7 != 0) {
                    iVar7 = strcmp(pcVar25,".and_gate_delay");
                    if (iVar7 != 0) {
                      iVar7 = strcmp(pcVar25,".exdc");
                      if (iVar7 == 0) goto LAB_002da2e7;
                      iVar7 = strcmp(pcVar25,".end");
                      if (iVar7 == 0) {
                        pVVar15 = Io_ReadBlifGetTokens(p);
                        p->vTokens = pVVar15;
                        goto LAB_002da2e7;
                      }
                      iVar7 = strcmp(pcVar25,".blackbox");
                      pAVar12 = local_38;
                      if (iVar7 == 0) {
                        local_38->ntkType = ABC_NTK_NETLIST;
                        local_38->ntkFunc = ABC_FUNC_BLACKBOX;
                        bVar5 = false;
                        Mem_FlexStop((Mem_Flex_t *)local_38->pManFunc,0);
                        pAVar12->pManFunc = (void *)0x0;
                      }
                      else {
                        pcVar14 = p->pFileName;
                        bVar5 = false;
                        uVar9 = Extra_FileReaderGetLineNumber(p->pReader,0);
                        printf("%s (line %d): Skipping directive \"%s\".\n",pcVar14,(ulong)uVar9,
                               pcVar25);
                      }
                      goto LAB_002d9f31;
                    }
                    iVar7 = strncmp(pcVar25,".and_gate_delay",0x19);
                    if (iVar7 != 0) {
                      __assert_fail("strncmp( (char *)vTokens->pArray[0], \".and_gate_delay\", 25 ) == 0"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                                    ,0x4dc,
                                    "int Io_ReadBlifNetworkAndGateDelay(Io_ReadBlif_t *, Vec_Ptr_t *)"
                                   );
                    }
                    if (pVVar15->nSize == 2) {
                      dVar4 = strtod((char *)ppvVar2[1],&pFoo1);
                      if (*pFoo1 != '\0') {
                        iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                        p->LineCur = iVar7;
                        sprintf(pcVar13,
                                "Bad value (%s) for AND gate delay in on .and_gate_delay line line."
                                ,pVVar15->pArray[1]);
                        goto LAB_002da18c;
                      }
                      p->pNtkCur->AndGateDelay = (float)dVar4;
                      bVar6 = false;
                    }
                    else {
                      iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                      p->LineCur = iVar7;
                      sprintf(pcVar13,
                              "Wrong number of arguments (%d) on .and_gate_delay line (should be 1)."
                              ,(ulong)(pVVar15->nSize - 1));
LAB_002da18c:
                      Io_ReadBlifPrintErrorMessage(p);
                      bVar6 = true;
                    }
                    bVar5 = false;
                    goto LAB_002d9f31;
                  }
                  iVar7 = strncmp(pcVar25,".default_output_load",0x15);
                  if (iVar7 != 0) {
                    __assert_fail("strncmp( (char *)vTokens->pArray[0], \".default_output_load\", 21 ) == 0"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                                  ,0x4b2,
                                  "int Io_ReadBlifNetworkDefaultOutputLoad(Io_ReadBlif_t *, Vec_Ptr_t *)"
                                 );
                  }
                  if (pVVar15->nSize != 3) {
                    iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                    p->LineCur = iVar7;
                    builtin_strncpy(pcVar13,"Wrong number of arguments on .default_output_loa",0x30)
                    ;
                    uVar21 = 0x2e656e696c2064;
                    goto LAB_002da0dd;
                  }
                  dVar4 = strtod((char *)ppvVar2[1],&pFoo1);
                  local_58._8_4_ = extraout_XMM0_Dc_02;
                  local_58._0_8_ = dVar4;
                  local_58._12_4_ = extraout_XMM0_Dd_02;
                  dVar4 = strtod((char *)pVVar15->pArray[2],&local_68);
                  if ((*pFoo1 != '\0') || (*local_68 != '\0')) {
                    iVar7 = Extra_FileReaderGetLineNumber(p->pReader,0);
                    p->LineCur = iVar7;
                    pvVar22 = pVVar15->pArray[1];
                    pvVar20 = pVVar15->pArray[2];
                    pcVar25 = 
                    "Bad value (%s %s) for rise or fall time on .default_output_load line.";
                    goto LAB_002d9f17;
                  }
                  p->DefOutLoadRise = (float)(double)local_58._0_8_;
                  p->DefOutLoadFall = (float)dVar4;
                  p->fHaveDefOutLoad = 1;
                }
LAB_002da12d:
                bVar6 = false;
              }
              bVar5 = false;
              goto LAB_002d9f31;
            }
            for (lVar24 = 1; lVar24 < pVVar15->nSize; lVar24 = lVar24 + 1) {
              Io_ReadCreatePo(p->pNtkCur,(char *)pVVar15->pArray[lVar24]);
            }
          }
LAB_002d94c2:
          bVar5 = false;
          bVar6 = false;
        }
      }
LAB_002d9f31:
      if (p->vTokens == (Vec_Ptr_t *)0x0) {
LAB_002da2e7:
        if (p->pNtkMaster == (Abc_Ntk_t *)0x0) {
          Extra_ProgressBarStop(local_40);
          return local_38;
        }
        return local_38;
      }
      if (bVar6) {
        Extra_ProgressBarStop(local_40);
        Abc_NtkDelete(local_38);
        return (Abc_Ntk_t *)0x0;
      }
    }
    uVar8 = uVar8 + 1;
  } while( true );
  Vec_StrPush(p->vCubes,' ');
  Vec_StrPush(p->vCubes,cVar1);
  Vec_StrPush(p->vCubes,'\n');
  goto LAB_002d91fe;
}

Assistant:

Abc_Ntk_t * Io_ReadBlifNetworkOne( Io_ReadBlif_t * p )
{
    ProgressBar * pProgress = NULL;
    Abc_Ntk_t * pNtk;
    char * pDirective;
    int iLine, fTokensReady, fStatus;

    // make sure the tokens are present
    assert( p->vTokens != NULL );

    // create the new network
    p->pNtkCur = pNtk = Abc_NtkAlloc( ABC_NTK_NETLIST, ABC_FUNC_SOP, 1 );
    // read the model name
    if ( strcmp( (char *)p->vTokens->pArray[0], ".model" ) == 0 )
    {
        char * pToken, * pPivot;
        if ( Vec_PtrSize(p->vTokens) != 2 )
        {
            p->LineCur = Extra_FileReaderGetLineNumber(p->pReader, 0);
            sprintf( p->sError, "The .model line does not have exactly two entries." );
            Io_ReadBlifPrintErrorMessage( p );
            return NULL;
        }
        for ( pPivot = pToken = (char *)Vec_PtrEntry(p->vTokens, 1); *pToken; pToken++ )
            if ( *pToken == '/' || *pToken == '\\' )
                pPivot = pToken+1;
        pNtk->pName = Extra_UtilStrsav( pPivot );
    }
    else if ( strcmp( (char *)p->vTokens->pArray[0], ".exdc" ) != 0 ) 
    {
        printf( "%s: File parsing skipped after line %d (\"%s\").\n", p->pFileName, 
            Extra_FileReaderGetLineNumber(p->pReader, 0), (char*)p->vTokens->pArray[0] );
        Abc_NtkDelete(pNtk);
        p->pNtkCur = NULL;
        return NULL;
    }

    // read the inputs/outputs
    if ( p->pNtkMaster == NULL )
        pProgress = Extra_ProgressBarStart( stdout, Extra_FileReaderGetFileSize(p->pReader) );
    fTokensReady = fStatus = 0;
    for ( iLine = 0; fTokensReady || (p->vTokens = Io_ReadBlifGetTokens(p)); iLine++ )
    {
        if ( p->pNtkMaster == NULL && iLine % 1000 == 0 )
            Extra_ProgressBarUpdate( pProgress, Extra_FileReaderGetCurPosition(p->pReader), NULL );

        // consider different line types
        fTokensReady = 0;
        pDirective = (char *)p->vTokens->pArray[0];
        if ( !strcmp( pDirective, ".names" ) )
            { fStatus = Io_ReadBlifNetworkNames( p, &p->vTokens ); fTokensReady = 1; }
        else if ( !strcmp( pDirective, ".gate" ) )
            fStatus = Io_ReadBlifNetworkGate( p, p->vTokens );
        else if ( !strcmp( pDirective, ".latch" ) )
            fStatus = Io_ReadBlifNetworkLatch( p, p->vTokens );
        else if ( !strcmp( pDirective, ".inputs" ) )
            fStatus = Io_ReadBlifNetworkInputs( p, p->vTokens );
        else if ( !strcmp( pDirective, ".outputs" ) )
            fStatus = Io_ReadBlifNetworkOutputs( p, p->vTokens );
        else if ( !strcmp( pDirective, ".input_arrival" ) )
            fStatus = Io_ReadBlifNetworkInputArrival( p, p->vTokens );
        else if ( !strcmp( pDirective, ".output_required" ) )
            fStatus = Io_ReadBlifNetworkOutputRequired( p, p->vTokens );
        else if ( !strcmp( pDirective, ".default_input_arrival" ) )
            fStatus = Io_ReadBlifNetworkDefaultInputArrival( p, p->vTokens );
        else if ( !strcmp( pDirective, ".default_output_required" ) )
            fStatus = Io_ReadBlifNetworkDefaultOutputRequired( p, p->vTokens );
        else if ( !strcmp( pDirective, ".input_drive" ) )
            fStatus = Io_ReadBlifNetworkInputDrive( p, p->vTokens );
        else if ( !strcmp( pDirective, ".output_load" ) )
            fStatus = Io_ReadBlifNetworkOutputLoad( p, p->vTokens );
        else if ( !strcmp( pDirective, ".default_input_drive" ) )
            fStatus = Io_ReadBlifNetworkDefaultInputDrive( p, p->vTokens );
        else if ( !strcmp( pDirective, ".default_output_load" ) )
            fStatus = Io_ReadBlifNetworkDefaultOutputLoad( p, p->vTokens );
        else if ( !strcmp( pDirective, ".and_gate_delay" ) )
            fStatus = Io_ReadBlifNetworkAndGateDelay( p, p->vTokens );
//        else if ( !strcmp( pDirective, ".subckt" ) )
//            fStatus = Io_ReadBlifNetworkSubcircuit( p, p->vTokens );
        else if ( !strcmp( pDirective, ".exdc" ) )
            break;
        else if ( !strcmp( pDirective, ".end" ) )
        {
            p->vTokens = Io_ReadBlifGetTokens(p);
            break;
        }
        else if ( !strcmp( pDirective, ".blackbox" ) )
        {
            pNtk->ntkType = ABC_NTK_NETLIST;
            pNtk->ntkFunc = ABC_FUNC_BLACKBOX;
            Mem_FlexStop( (Mem_Flex_t *)pNtk->pManFunc, 0 );
            pNtk->pManFunc = NULL;
        }
        else
            printf( "%s (line %d): Skipping directive \"%s\".\n", p->pFileName, 
                Extra_FileReaderGetLineNumber(p->pReader, 0), pDirective );
        if ( p->vTokens == NULL ) // some files do not have ".end" in the end
            break;
        if ( fStatus == 1 )
        {
            Extra_ProgressBarStop( pProgress );
            Abc_NtkDelete( pNtk );
            return NULL;
        }
    }
    if ( p->pNtkMaster == NULL )
        Extra_ProgressBarStop( pProgress );
    return pNtk;
}